

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O1

int __thiscall DateTime::DayOfYear(DateTime *this,int year,int month,int day)

{
  bool bVar1;
  int iVar2;
  undefined1 *puVar3;
  
  if (((0 < day) && (0xffffd8f0 < year - 10000U)) && (0xfffffff3 < month - 0xdU)) {
    iVar2 = DaysInMonth(year,month);
    if (day <= iVar2) {
      bVar1 = IsLeapYear(year);
      puVar3 = (anonymous_namespace)::cumulDaysInMonth;
      if (bVar1) {
        puVar3 = (undefined1 *)0x115124;
      }
      return day + *(int *)(puVar3 + (ulong)(uint)month * 4);
    }
  }
  __assert_fail("false && \"Invalid year, month and day\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/third-party/sgp4/libsgp4/DateTime.h"
                ,0x112,"int DateTime::DayOfYear(int, int, int) const");
}

Assistant:

int DayOfYear(int year, int month, int day) const
    {
        if (!IsValidYearMonthDay(year, month, day))
        {
            assert(false && "Invalid year, month and day");
        }

        int daysThisYear = day;

        if (IsLeapYear(year))
        {
            daysThisYear += cumulDaysInMonth[1][month];
        }
        else
        {
            daysThisYear += cumulDaysInMonth[0][month];
        }

        return daysThisYear;
    }